

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,uchar4 *v)

{
  ostream *poVar1;
  byte *pbVar2;
  uchar4 *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  pbVar2 = array<unsigned_char,_4UL>::operator[](v,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pbVar2 = array<unsigned_char,_4UL>::operator[](v,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pbVar2 = array<unsigned_char,_4UL>::operator[](v,2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pbVar2 = array<unsigned_char,_4UL>::operator[](v,3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::uchar4 &v) {
  os << "(" << int(v[0]) << ", " << int(v[1]) << ", " << int(v[2]) << ", "
     << int(v[3]) << ")";
  return os;
}